

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O3

int __thiscall zmq::udp_engine_t::add_membership(udp_engine_t *this,fd_t s_,udp_address_t *addr_)

{
  int iVar1;
  int iVar2;
  ip_addr_t *piVar3;
  socklen_t __optlen;
  ip_mreq mreq;
  undefined8 local_38;
  undefined8 uStack_30;
  int local_28;
  
  piVar3 = udp_address_t::target_addr(addr_);
  iVar1 = ip_addr_t::family(piVar3);
  if (iVar1 == 2) {
    local_38 = CONCAT44(local_38._4_4_,(piVar3->ipv6).sin6_flowinfo);
    piVar3 = udp_address_t::bind_addr(addr_);
    local_38 = CONCAT44((piVar3->ipv6).sin6_flowinfo,(undefined4)local_38);
    iVar2 = 0;
    iVar1 = 0x23;
    __optlen = 8;
  }
  else {
    iVar1 = ip_addr_t::family(piVar3);
    iVar2 = 0;
    if (iVar1 != 10) goto LAB_001f6225;
    local_28 = udp_address_t::bind_if(addr_);
    if (local_28 < -1) {
      add_membership();
    }
    local_38 = *(undefined8 *)((piVar3->generic).sa_data + 6);
    uStack_30 = *(undefined8 *)((long)&(piVar3->ipv6).sin6_addr.__in6_u + 8);
    iVar2 = 0x29;
    iVar1 = 0x14;
    __optlen = 0x14;
  }
  iVar2 = setsockopt(s_,iVar2,iVar1,&local_38,__optlen);
LAB_001f6225:
  assert_success_or_recoverable(s_,iVar2);
  return iVar2;
}

Assistant:

int zmq::udp_engine_t::add_membership (fd_t s_, const udp_address_t *addr_)
{
    const ip_addr_t *mcast_addr = addr_->target_addr ();
    int rc = 0;

    if (mcast_addr->family () == AF_INET) {
        struct ip_mreq mreq;
        mreq.imr_multiaddr = mcast_addr->ipv4.sin_addr;
        mreq.imr_interface = addr_->bind_addr ()->ipv4.sin_addr;

        rc = setsockopt (s_, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                         reinterpret_cast<char *> (&mreq), sizeof (mreq));

    } else if (mcast_addr->family () == AF_INET6) {
        struct ipv6_mreq mreq;
        const int iface = addr_->bind_if ();

        zmq_assert (iface >= -1);

        mreq.ipv6mr_multiaddr = mcast_addr->ipv6.sin6_addr;
        mreq.ipv6mr_interface = iface;

        rc = setsockopt (s_, IPPROTO_IPV6, IPV6_ADD_MEMBERSHIP,
                         reinterpret_cast<char *> (&mreq), sizeof (mreq));
    }

    assert_success_or_recoverable (s_, rc);
    return rc;
}